

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

HRESULT __thiscall Js::ScriptContext::OnDebuggerDetached(ScriptContext *this)

{
  InterruptPoller *pIVar1;
  bool bVar2;
  HRESULT hr;
  uint hr_00;
  int iVar3;
  DebugContext *pDVar4;
  StepController *this_00;
  undefined1 local_40 [8];
  OldCodeGenAutoDelete autoDelete;
  AutoDisableInterrupt autoDisableInterrupt;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  Output::Trace(DebuggerPhase,L"ScriptContext::OnDebuggerDetached: start 0x%p\n",this);
  this_00 = &this->threadContext->debugManager->stepController;
  bVar2 = StepController::IsActive(this_00);
  if (bVar2) {
    StepController::Deactivate(this_00,(InterpreterHaltState *)0x0);
  }
  local_40 = (undefined1  [8])0x0;
  autoDelete.oldCodegen = (NativeCodeGenerator *)this;
  hr = OnDebuggerAttachedDetached(this,false,(NativeCodeGenerator **)local_40);
  if (hr != 0) {
    Debugger_AttachDetach_unrecoverable_error(hr);
  }
  pDVar4 = GetDebugContext(this);
  DebugContext::SetDebuggerMode(pDVar4,SourceRundown);
  autoDelete.sc = (ScriptContext *)this->threadContext;
  autoDisableInterrupt.m_threadContext._0_2_ = 0;
  autoDisableInterrupt.m_threadContext._2_1_ = 0;
  pIVar1 = ((ThreadContext *)autoDelete.sc)->interruptPoller;
  if (pIVar1 != (InterruptPoller *)0x0) {
    autoDisableInterrupt.m_threadContext._0_2_ = (ushort)pIVar1->isDisabled << 8;
    pIVar1->isDisabled = true;
  }
  pDVar4 = GetDebugContext(this);
  hr_00 = DebugContext::RundownSourcesAndReparse(pDVar4,false,true);
  iVar3 = (*(this->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(this);
  if ((char)iVar3 == '\0') {
    if (hr_00 != 0) {
      Debugger_AttachDetach_unrecoverable_error(hr_00);
    }
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)&autoDisableInterrupt.field_0xc,
               ExceptionType_OutOfMemory);
    UpdateRecyclerFunctionEntryPointsForDebugger(this);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)&autoDisableInterrupt.field_0xc);
    Output::Trace(DebuggerPhase,L"ScriptContext::OnDebuggerDetached: done 0x%p, hr = 0x%X\n",this,
                  (ulong)hr_00);
  }
  AutoDisableInterrupt::~AutoDisableInterrupt((AutoDisableInterrupt *)&autoDelete.sc);
  OldCodeGenAutoDelete::~OldCodeGenAutoDelete((OldCodeGenAutoDelete *)local_40);
  return hr_00;
}

Assistant:

HRESULT ScriptContext::OnDebuggerDetached()
    {
        OUTPUT_TRACE(Js::DebuggerPhase, _u("ScriptContext::OnDebuggerDetached: start 0x%p\n"), this);

#if ENABLE_NATIVE_CODEGEN
#if PDATA_ENABLED && defined(_WIN32)
        // in case of debugger detaching, we have a new code generator and when deleting old code generator,
        // the xData is not put in the delay list yet. clear the list now so the code addresses are ready to reuse
        struct AutoReset
        {
            AutoReset(ThreadContext* threadContext)
                :threadContext(threadContext)
            {
                // indicate background thread that we need help to delete the xData
                threadContext->GetJobProcessor()->StartExtraWork();
            }
            ~AutoReset()
            {
                threadContext->GetJobProcessor()->EndExtraWork();
                // in case the background thread didn't clear all the function tables
                DelayDeletingFunctionTable::Clear();
            }

            ThreadContext* threadContext;
        } autoReset(this->GetThreadContext());
#endif
#endif

        Js::StepController* stepController = &this->GetThreadContext()->GetDebugManager()->stepController;
        if (stepController->IsActive())
        {
            // Normally step controller is deactivated on start of dispatch (step, async break, exception, etc),
            // and in the beginning of interpreter loop we check for step complete (can cause check whether current bytecode belong to stmt).
            // But since it holds to functionBody/statementMaps, we have to deactivate it as func bodies are going away/reparsed.
            stepController->Deactivate();
        }

        // Go through all existing functions and change their thunks back to using non-debug mode versions when called
        // and notify the script context that the debugger has detached to allow it to revert the runtime to the proper
        // state (JIT enabled).

#if ENABLE_NATIVE_CODEGEN
        OldCodeGenAutoDelete autoDelete(this);
        HRESULT hr = OnDebuggerAttachedDetached(/*attach*/ false, &(autoDelete.oldCodegen));
#else // ENABLE_NATIVE_CODEGEN
        HRESULT hr = OnDebuggerAttachedDetached(/*attach*/ false);
#endif

        // Debugger attach/detach failure is catastrophic, take down the process
        DEBUGGER_ATTACHDETACH_FATAL_ERROR_IF_FAILED(hr);

        // Move the debugger into source rundown mode.
        this->GetDebugContext()->SetDebuggerMode(Js::DebuggerMode::SourceRundown);

        // Disable QC while functions are re-parsed as this can be time consuming
        AutoDisableInterrupt autoDisableInterrupt(this->threadContext, false /* explicitCompletion */);

#if ENABLE_NATIVE_CODEGEN
#if PDATA_ENABLED && defined(_WIN32)
        // RundownSourcesAndReparse can cause code generation immediately, clear the leftovers if background thread didn't finish the work
        DelayDeletingFunctionTable::Clear();
#endif
#endif

        // Force a reparse so that indirect function caches are updated.
        hr = this->GetDebugContext()->RundownSourcesAndReparse(/*shouldPerformSourceRundown*/ false, /*shouldReparseFunctions*/ true);

        if (this->IsClosed())
        {
            return hr;
        }

        // Debugger attach/detach failure is catastrophic, take down the process
        DEBUGGER_ATTACHDETACH_FATAL_ERROR_IF_FAILED(hr);

        HRESULT hrEntryPointUpdate = S_OK;
        BEGIN_TRANSLATE_OOM_TO_HRESULT_NESTED
        {
            // Still do the pass on the function's entrypoint to reflect its state with the functionbody's entrypoint.
            this->UpdateRecyclerFunctionEntryPointsForDebugger();
        }